

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaVPushText(xmlSchemaValidCtxtPtr vctxt,int nodeType,xmlChar *value,int len,int mode,
                      int *consumed)

{
  int iVar1;
  xmlChar *pxVar2;
  int *consumed_local;
  int mode_local;
  int len_local;
  xmlChar *value_local;
  int nodeType_local;
  xmlSchemaValidCtxtPtr vctxt_local;
  
  if (consumed != (int *)0x0) {
    *consumed = 0;
  }
  if ((vctxt->inode->flags & 4U) == 0) {
    if (vctxt->inode->typeDef->contentType == XML_SCHEMA_CONTENT_EMPTY) {
      xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_CVC_COMPLEX_TYPE_2_1,
                         (xmlNodePtr)0x0,(xmlSchemaBasicItemPtr)0x0,
                         "Character content is not allowed, because the content type is empty",
                         (xmlChar *)0x0,(xmlChar *)0x0);
      vctxt_local._4_4_ = vctxt->err;
    }
    else if (vctxt->inode->typeDef->contentType == XML_SCHEMA_CONTENT_ELEMENTS) {
      if ((nodeType == 3) && (iVar1 = xmlSchemaIsBlank(value,len), iVar1 != 0)) {
        vctxt_local._4_4_ = 0;
      }
      else {
        xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_CVC_COMPLEX_TYPE_2_3,
                           (xmlNodePtr)0x0,(xmlSchemaBasicItemPtr)0x0,
                           "Character content other than whitespace is not allowed because the content type is \'element-only\'"
                           ,(xmlChar *)0x0,(xmlChar *)0x0);
        vctxt_local._4_4_ = vctxt->err;
      }
    }
    else if ((value == (xmlChar *)0x0) || (*value == '\0')) {
      vctxt_local._4_4_ = 0;
    }
    else if ((vctxt->inode->typeDef->contentType == XML_SCHEMA_CONTENT_MIXED) &&
            ((vctxt->inode->decl == (xmlSchemaElementPtr)0x0 ||
             (vctxt->inode->decl->value == (xmlChar *)0x0)))) {
      vctxt_local._4_4_ = 0;
    }
    else {
      if (vctxt->inode->value == (xmlChar *)0x0) {
        if (mode == 1) {
          vctxt->inode->value = value;
        }
        else if (mode == 2) {
          vctxt->inode->value = value;
          if (consumed != (int *)0x0) {
            *consumed = 1;
          }
          vctxt->inode->flags = vctxt->inode->flags | 2;
        }
        else if (mode == 3) {
          if (len == -1) {
            pxVar2 = xmlStrdup(value);
            vctxt->inode->value = pxVar2;
          }
          else {
            pxVar2 = xmlStrndup(value,len);
            vctxt->inode->value = pxVar2;
          }
          vctxt->inode->flags = vctxt->inode->flags | 2;
        }
      }
      else {
        consumed_local._4_4_ = len;
        if (len < 0) {
          consumed_local._4_4_ = xmlStrlen(value);
        }
        if ((vctxt->inode->flags & 2U) == 0) {
          pxVar2 = xmlStrncatNew(vctxt->inode->value,value,consumed_local._4_4_);
          vctxt->inode->value = pxVar2;
          vctxt->inode->flags = vctxt->inode->flags | 2;
        }
        else {
          pxVar2 = xmlStrncat(vctxt->inode->value,value,consumed_local._4_4_);
          vctxt->inode->value = pxVar2;
        }
      }
      vctxt_local._4_4_ = 0;
    }
  }
  else {
    xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_CVC_ELT_3_2_1,(xmlNodePtr)0x0,
                       (xmlSchemaBasicItemPtr)0x0,
                       "Neither character nor element content is allowed because the element is \'nilled\'"
                       ,(xmlChar *)0x0,(xmlChar *)0x0);
    vctxt_local._4_4_ = vctxt->err;
  }
  return vctxt_local._4_4_;
}

Assistant:

static int
xmlSchemaVPushText(xmlSchemaValidCtxtPtr vctxt,
		  int nodeType, const xmlChar *value, int len,
		  int mode, int *consumed)
{
    /*
    * Unfortunately we have to duplicate the text sometimes.
    * OPTIMIZE: Maybe we could skip it, if:
    *   1. content type is simple
    *   2. whitespace is "collapse"
    *   3. it consists of whitespace only
    *
    * Process character content.
    */
    if (consumed != NULL)
	*consumed = 0;
    if (INODE_NILLED(vctxt->inode)) {
	/*
	* SPEC cvc-elt (3.3.4 - 3.2.1)
	* "The element information item must have no character or
	* element information item [children]."
	*/
	VERROR(XML_SCHEMAV_CVC_ELT_3_2_1, NULL,
	    "Neither character nor element content is allowed "
	    "because the element is 'nilled'");
	return (vctxt->err);
    }
    /*
    * SPEC (2.1) "If the {content type} is empty, then the
    * element information item has no character or element
    * information item [children]."
    */
    if (vctxt->inode->typeDef->contentType ==
	    XML_SCHEMA_CONTENT_EMPTY) {
	VERROR(XML_SCHEMAV_CVC_COMPLEX_TYPE_2_1, NULL,
	    "Character content is not allowed, "
	    "because the content type is empty");
	return (vctxt->err);
    }

    if (vctxt->inode->typeDef->contentType ==
	    XML_SCHEMA_CONTENT_ELEMENTS) {
	if ((nodeType != XML_TEXT_NODE) ||
	    (! xmlSchemaIsBlank((xmlChar *) value, len))) {
	    /*
	    * SPEC cvc-complex-type (2.3)
	    * "If the {content type} is element-only, then the
	    * element information item has no character information
	    * item [children] other than those whose [character
	    * code] is defined as a white space in [XML 1.0 (Second
	    * Edition)]."
	    */
	    VERROR(XML_SCHEMAV_CVC_COMPLEX_TYPE_2_3, NULL,
		"Character content other than whitespace is not allowed "
		"because the content type is 'element-only'");
	    return (vctxt->err);
	}
	return (0);
    }

    if ((value == NULL) || (value[0] == 0))
	return (0);
    /*
    * Save the value.
    * NOTE that even if the content type is *mixed*, we need the
    * *initial value* for default/fixed value constraints.
    */
    if ((vctxt->inode->typeDef->contentType == XML_SCHEMA_CONTENT_MIXED) &&
	((vctxt->inode->decl == NULL) ||
	(vctxt->inode->decl->value == NULL)))
	return (0);

    if (vctxt->inode->value == NULL) {
	/*
	* Set the value.
	*/
	switch (mode) {
	    case XML_SCHEMA_PUSH_TEXT_PERSIST:
		/*
		* When working on a tree.
		*/
		vctxt->inode->value = value;
		break;
	    case XML_SCHEMA_PUSH_TEXT_CREATED:
		/*
		* When working with the reader.
		* The value will be freed by the element info.
		*/
		vctxt->inode->value = value;
		if (consumed != NULL)
		    *consumed = 1;
		vctxt->inode->flags |=
		    XML_SCHEMA_NODE_INFO_FLAG_OWNED_VALUES;
		break;
	    case XML_SCHEMA_PUSH_TEXT_VOLATILE:
		/*
		* When working with SAX.
		* The value will be freed by the element info.
		*/
		if (len != -1)
		    vctxt->inode->value = BAD_CAST xmlStrndup(value, len);
		else
		    vctxt->inode->value = BAD_CAST xmlStrdup(value);
		vctxt->inode->flags |=
		    XML_SCHEMA_NODE_INFO_FLAG_OWNED_VALUES;
		break;
	    default:
		break;
	}
    } else {
	if (len < 0)
	    len = xmlStrlen(value);
	/*
	* Concat the value.
	*/
	if (vctxt->inode->flags & XML_SCHEMA_NODE_INFO_FLAG_OWNED_VALUES) {
	    vctxt->inode->value = BAD_CAST xmlStrncat(
		(xmlChar *) vctxt->inode->value, value, len);
	} else {
	    vctxt->inode->value =
		BAD_CAST xmlStrncatNew(vctxt->inode->value, value, len);
	    vctxt->inode->flags |= XML_SCHEMA_NODE_INFO_FLAG_OWNED_VALUES;
	}
    }

    return (0);
}